

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O3

void LoadParameters(string *file_name)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  vector<int,_std::allocator<int>_> temp;
  FileStorage fs;
  VecReaderProxy<int,_1> r;
  vector<int,_std::allocator<int>_> local_1f8;
  FileStorage local_1d8 [64];
  Mat *local_198;
  undefined8 local_190;
  Mat local_188;
  undefined7 uStack_187;
  Mat local_128 [96];
  Mat local_c8 [144];
  VecReaderProxy<int,_1> local_38;
  char local_30 [24];
  
  local_190 = 0;
  local_188 = (Mat)0x0;
  local_198 = &local_188;
  cv::FileStorage::FileStorage(local_1d8,(string *)file_name,0,(string *)&local_198);
  if (local_198 != &local_188) {
    operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
  }
  cVar1 = cv::FileStorage::isOpened();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to open ini parameters",0x1d);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    exit(-1);
  }
  cv::FileStorage::operator[]((char *)&local_1f8);
  local_190 = 0;
  local_188 = (Mat)0x0;
  local_198 = &local_188;
  cv::read((FileNode *)&local_1f8,(string *)&cam_model_abi_cxx11_,(string *)&local_198);
  if (local_198 != &local_188) {
    operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
  }
  cv::FileStorage::operator[](local_30);
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cv::FileNode::begin();
  local_38.it = (FileNodeIterator *)&local_198;
  cv::internal::VecReaderProxy<int,_1>::operator()(&local_38,&local_1f8,0x7fffffff);
  if ((long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 8) {
    iVar2 = *local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    iVar3 = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1];
  }
  else {
    iVar3 = 0;
    iVar2 = 0;
    iVar4 = 0;
    if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (int *)0x0) goto LAB_001049d0;
  }
  operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  iVar4 = iVar2;
LAB_001049d0:
  cv::FileStorage::operator[]((char *)&local_1f8);
  cv::Mat::Mat((Mat *)&local_198);
  cv::read((FileNode *)&local_1f8,(Mat *)Kl,(Mat *)&local_198);
  cv::Mat::~Mat((Mat *)&local_198);
  cv::FileStorage::operator[]((char *)&local_1f8);
  cv::Mat::Mat((Mat *)&local_198);
  cv::read((FileNode *)&local_1f8,(Mat *)Dl,(Mat *)&local_198);
  cv::Mat::~Mat((Mat *)&local_198);
  cv::FileStorage::operator[]((char *)&local_1f8);
  cv::Mat::Mat((Mat *)&local_198);
  cv::read((FileNode *)&local_1f8,(Mat *)xil,(Mat *)&local_198);
  cv::Mat::~Mat((Mat *)&local_198);
  cv::Mat::eye((int)&local_198,3,3);
  (**(code **)(*(long *)local_198 + 0x18))(local_198,&local_198,Rl,0xffffffff);
  cv::Mat::~Mat(local_c8);
  cv::Mat::~Mat(local_128);
  cv::Mat::~Mat(&local_188);
  iVar2 = std::__cxx11::string::compare((char *)&cam_model_abi_cxx11_);
  if (iVar2 == 0) {
    cv::FileStorage::operator[]((char *)&local_1f8);
    cv::Mat::Mat((Mat *)&local_198);
    cv::read((FileNode *)&local_1f8,(Mat *)Rl,(Mat *)&local_198);
    cv::Mat::~Mat((Mat *)&local_198);
    cv::FileStorage::operator[]((char *)&local_1f8);
    cv::Mat::Mat((Mat *)&local_198);
    cv::read((FileNode *)&local_1f8,(Mat *)Kr,(Mat *)&local_198);
    cv::Mat::~Mat((Mat *)&local_198);
    cv::FileStorage::operator[]((char *)&local_1f8);
    cv::Mat::Mat((Mat *)&local_198);
    cv::read((FileNode *)&local_1f8,(Mat *)Dr,(Mat *)&local_198);
    cv::Mat::~Mat((Mat *)&local_198);
    cv::FileStorage::operator[]((char *)&local_1f8);
    cv::Mat::Mat((Mat *)&local_198);
    cv::read((FileNode *)&local_1f8,(Mat *)xir,(Mat *)&local_198);
    cv::Mat::~Mat((Mat *)&local_198);
    cv::FileStorage::operator[]((char *)&local_1f8);
    cv::Mat::Mat((Mat *)&local_198);
    cv::read((FileNode *)&local_1f8,(Mat *)Rr,(Mat *)&local_198);
    cv::Mat::~Mat((Mat *)&local_198);
    cv::FileStorage::operator[]((char *)&local_1f8);
    cv::Mat::Mat((Mat *)&local_198);
    cv::read((FileNode *)&local_1f8,(Mat *)Translation,(Mat *)&local_198);
    cv::Mat::~Mat((Mat *)&local_198);
  }
  cv::FileStorage::release();
  cap_cols = iVar4;
  cap_rows = iVar3;
  img_width = iVar4;
  iVar2 = std::__cxx11::string::compare((char *)&cam_model_abi_cxx11_);
  if (iVar2 == 0) {
    img_width = iVar4 / 2;
  }
  cv::FileStorage::~FileStorage(local_1d8);
  return;
}

Assistant:

void LoadParameters(std::string file_name) {
  cv::FileStorage fs(file_name, cv::FileStorage::READ);
  if (!fs.isOpened()) {
    std::cout << "Failed to open ini parameters" << std::endl;
    exit(-1);
  }

  cv::Size cap_size;
  fs["cam_model"] >> cam_model;
  fs["cap_size" ] >> cap_size;
  fs["Kl"       ] >> Kl;
  fs["Dl"       ] >> Dl;
  fs["xil"      ] >> xil;
  Rl = cv::Mat::eye(3, 3, CV_64F);
  if (cam_model == "stereo") {
    fs["Rl"       ] >> Rl;
    fs["Kr"       ] >> Kr;
    fs["Dr"       ] >> Dr;
    fs["xir"      ] >> xir;
    fs["Rr"       ] >> Rr;
    fs["T"        ] >> Translation;
  }
  fs.release();

  img_width = cap_size.width;
  cap_cols  = cap_size.width;
  cap_rows  = cap_size.height;

  if (cam_model == "stereo")
    img_width  = cap_size.width / 2;
}